

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::OneofWellKnownTypes::clear_bytes_field(OneofWellKnownTypes *this)

{
  OneofFieldCase OVar1;
  Arena *pAVar2;
  OneofWellKnownTypes *this_local;
  
  OVar1 = oneof_field_case(this);
  if (OVar1 == kBytesField) {
    pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar2 == (Arena *)0x0) {
      if (*(long **)&this->field_0 != (long *)0x0) {
        (**(code **)(**(long **)&this->field_0 + 8))();
      }
    }
    else {
      google::protobuf::internal::MaybePoisonAfterClear
                ((this->field_0)._impl_.oneof_field_.any_field_);
    }
    clear_has_oneof_field(this);
  }
  return;
}

Assistant:

void OneofWellKnownTypes::clear_bytes_field() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (oneof_field_case() == kBytesField) {
    if (GetArena() == nullptr) {
      delete _impl_.oneof_field_.bytes_field_;
    } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
      ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.bytes_field_);
    }
    clear_has_oneof_field();
  }
}